

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

void xmlTextReaderStartElementNs
               (void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI,int nb_namespaces,
               xmlChar **namespaces,int nb_attributes,int nb_defaulted,xmlChar **attributes)

{
  long lVar1;
  xmlTextReaderPtr reader;
  xmlParserCtxtPtr ctxt;
  xmlChar **namespaces_local;
  int nb_namespaces_local;
  xmlChar *URI_local;
  xmlChar *prefix_local;
  xmlChar *localname_local;
  void *ctx_local;
  
  lVar1 = *(long *)((long)ctx + 0x1a8);
  if ((((lVar1 != 0) && (*(long *)(lVar1 + 0x48) != 0)) &&
      ((**(code **)(lVar1 + 0x48))
                 (ctx,localname,prefix,URI,nb_namespaces,namespaces,nb_attributes,nb_defaulted,
                  attributes), *(long *)((long)ctx + 0x50) != 0)) &&
     (((*(long *)((long)ctx + 0x38) != 0 && (*(long *)(*(long *)((long)ctx + 0x38) + 0x20) != 0)) &&
      ((**(char **)(*(long *)((long)ctx + 0x38) + 0x20) == '/' &&
       (*(char *)(*(long *)(*(long *)((long)ctx + 0x38) + 0x20) + 1) == '>')))))) {
    *(undefined2 *)(*(long *)((long)ctx + 0x50) + 0x72) = 1;
  }
  if (lVar1 != 0) {
    *(undefined4 *)(lVar1 + 0x18) = 1;
  }
  return;
}

Assistant:

static void
xmlTextReaderStartElementNs(void *ctx,
                      const xmlChar *localname,
		      const xmlChar *prefix,
		      const xmlChar *URI,
		      int nb_namespaces,
		      const xmlChar **namespaces,
		      int nb_attributes,
		      int nb_defaulted,
		      const xmlChar **attributes)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlTextReaderPtr reader = ctxt->_private;

#ifdef DEBUG_CALLBACKS
    printf("xmlTextReaderStartElementNs(%s)\n", localname);
#endif
    if ((reader != NULL) && (reader->startElementNs != NULL)) {
	reader->startElementNs(ctx, localname, prefix, URI, nb_namespaces,
	                       namespaces, nb_attributes, nb_defaulted,
			       attributes);
	if ((ctxt->node != NULL) && (ctxt->input != NULL) &&
	    (ctxt->input->cur != NULL) && (ctxt->input->cur[0] == '/') &&
	    (ctxt->input->cur[1] == '>'))
	    ctxt->node->extra = NODE_IS_EMPTY;
    }
    if (reader != NULL)
	reader->state = XML_TEXTREADER_ELEMENT;
}